

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O2

void __thiscall intel_acbp_v2_t::acbp_element_t::_read(acbp_element_t *this)

{
  header_t *phVar1;
  ibbs_body_t *piVar2;
  pmda_body_t *ppVar3;
  structure_ids_t sVar4;
  header_t *this_00;
  ibbs_body_t *this_01;
  pmda_body_t *this_02;
  ulong uVar5;
  string local_40;
  
  this_00 = (header_t *)operator_new(0x30);
  header_t::header_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
  phVar1 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  (this->m_header)._M_t.
  super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
  .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl = this_00;
  if (phVar1 != (header_t *)0x0) {
    (**(code **)((long)(phVar1->super_kstruct)._vptr_kstruct + 8))();
    this_00 = (this->m_header)._M_t.
              super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
              ._M_t.
              super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
              .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  }
  this->n_ibbs_body = true;
  if ((this_00->m_structure_id == STRUCTURE_IDS_IBBS) && (0xb < this_00->m_total_size)) {
    this->n_ibbs_body = false;
    this_01 = (ibbs_body_t *)operator_new(0x88);
    ibbs_body_t::ibbs_body_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    piVar2 = (this->m_ibbs_body)._M_t.
             super___uniq_ptr_impl<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
             .super__Head_base<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_false>._M_head_impl;
    (this->m_ibbs_body)._M_t.
    super___uniq_ptr_impl<intel_acbp_v2_t::ibbs_body_t,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_std::default_delete<intel_acbp_v2_t::ibbs_body_t>_>
    .super__Head_base<0UL,_intel_acbp_v2_t::ibbs_body_t_*,_false>._M_head_impl = this_01;
    if (piVar2 != (ibbs_body_t *)0x0) {
      (**(code **)((long)(piVar2->super_kstruct)._vptr_kstruct + 8))();
    }
  }
  this->n_pmda_body = true;
  phVar1 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  if ((phVar1->m_structure_id == STRUCTURE_IDS_PMDA) && (0xb < phVar1->m_total_size)) {
    this->n_pmda_body = false;
    this_02 = (pmda_body_t *)operator_new(0x38);
    pmda_body_t::pmda_body_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
    ppVar3 = (this->m_pmda_body)._M_t.
             super___uniq_ptr_impl<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_intel_acbp_v2_t::pmda_body_t_*,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
             .super__Head_base<0UL,_intel_acbp_v2_t::pmda_body_t_*,_false>._M_head_impl;
    (this->m_pmda_body)._M_t.
    super___uniq_ptr_impl<intel_acbp_v2_t::pmda_body_t,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_intel_acbp_v2_t::pmda_body_t_*,_std::default_delete<intel_acbp_v2_t::pmda_body_t>_>
    .super__Head_base<0UL,_intel_acbp_v2_t::pmda_body_t_*,_false>._M_head_impl = this_02;
    if (ppVar3 != (pmda_body_t *)0x0) {
      (**(code **)((long)(ppVar3->super_kstruct)._vptr_kstruct + 8))();
    }
  }
  this->n_generic_body = true;
  phVar1 = (this->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::header_t,_std::default_delete<intel_acbp_v2_t::header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::header_t_*,_std::default_delete<intel_acbp_v2_t::header_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::header_t_*,_false>._M_head_impl;
  sVar4 = phVar1->m_structure_id;
  if (((sVar4 != STRUCTURE_IDS_PMDA) && (sVar4 != STRUCTURE_IDS_IBBS)) &&
     (uVar5 = (ulong)phVar1->m_total_size, 0xb < uVar5)) {
    this->n_generic_body = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_40,(this->super_kstruct).m__io,uVar5 - 0xc);
    std::__cxx11::string::operator=((string *)&this->m_generic_body,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void intel_acbp_v2_t::acbp_element_t::_read() {
    m_header = std::unique_ptr<header_t>(new header_t(m__io, this, m__root));
    n_ibbs_body = true;
    if ( ((header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_IBBS) && (header()->total_size() >= 12)) ) {
        n_ibbs_body = false;
        m_ibbs_body = std::unique_ptr<ibbs_body_t>(new ibbs_body_t(m__io, this, m__root));
    }
    n_pmda_body = true;
    if ( ((header()->structure_id() == intel_acbp_v2_t::STRUCTURE_IDS_PMDA) && (header()->total_size() >= 12)) ) {
        n_pmda_body = false;
        m_pmda_body = std::unique_ptr<pmda_body_t>(new pmda_body_t(m__io, this, m__root));
    }
    n_generic_body = true;
    if ( ((header()->structure_id() != intel_acbp_v2_t::STRUCTURE_IDS_IBBS) && (header()->structure_id() != intel_acbp_v2_t::STRUCTURE_IDS_PMDA) && (header()->total_size() >= 12)) ) {
        n_generic_body = false;
        m_generic_body = m__io->read_bytes((header()->total_size() - 12));
    }
}